

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

void hwnet::ThreadPool::threadFuncSwap(TaskQueue *queue_)

{
  bool bVar1;
  __shared_ptr_access<hwnet::Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this;
  element_type *peVar2;
  Ptr *task;
  undefined1 local_60 [8];
  taskque local_tasks;
  TaskQueue *queue__local;
  
  local_tasks.
  super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)queue_;
  std::deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::deque
            ((deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_> *)
             local_60);
  while (bVar1 = TaskQueue::Get((TaskQueue *)
                                local_tasks.
                                super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node,
                                (taskque *)local_60), bVar1) {
    while (bVar1 = std::
                   deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                   ::empty((deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                            *)local_60), ((bVar1 ^ 0xffU) & 1) != 0) {
      this = (__shared_ptr_access<hwnet::Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::
             deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::
             front((deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                    *)local_60);
      peVar2 = std::__shared_ptr_access<hwnet::Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this);
      (**peVar2->_vptr_Task)();
      std::deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::
      pop_front((deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                 *)local_60);
    }
  }
  std::deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::~deque
            ((deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_> *)
             local_60);
  return;
}

Assistant:

void ThreadPool::threadFuncSwap(ThreadPool::TaskQueue *queue_) {
	ThreadPool::TaskQueue::taskque local_tasks;
	for(;;) {
		if(!queue_->Get(local_tasks)) {
			return;
		}
		while(!local_tasks.empty()) {
			const Task::Ptr &task = local_tasks.front();
			task->Do();
			local_tasks.pop_front();
		}
	}
}